

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

string * __thiscall
soul::AST::Scope::makeUniqueName(string *__return_storage_ptr__,Scope *this,string *root)

{
  long *plVar1;
  pointer pcVar2;
  uint uVar3;
  bool bVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint uVar7;
  uint __len;
  uint __uval;
  uint __val;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  undefined8 local_58;
  long local_50;
  undefined8 uStack_48;
  string *local_40;
  anon_class_8_1_8991fb9c local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (root->_M_dataplus)._M_p;
  local_40 = root;
  local_38.this = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + root->_M_string_length);
  uVar7 = 1;
  do {
    bVar4 = makeUniqueName::anon_class_8_1_8991fb9c::operator()(&local_38,__return_storage_ptr__);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (local_40->_M_dataplus)._M_p;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + local_40->_M_string_length);
    std::__cxx11::string::append((char *)&local_80);
    __val = uVar7 + 1;
    __len = 1;
    if (8 < uVar7) {
      uVar7 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_0020a1c2;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_0020a1c2;
        }
        if (uVar7 < 10000) goto LAB_0020a1c2;
        bVar4 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar3 = __len + 4;
      } while (bVar4);
      __len = __len + 1;
    }
LAB_0020a1c2:
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,__len,__val);
    uVar6 = 0xf;
    if (local_80 != local_70) {
      uVar6 = local_70[0];
    }
    if (uVar6 < (ulong)(local_98 + local_78)) {
      uVar6 = 0xf;
      if (local_a0 != local_90) {
        uVar6 = local_90[0];
      }
      if (uVar6 < (ulong)(local_98 + local_78)) goto LAB_0020a22c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
    }
    else {
LAB_0020a22c:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
    }
    plVar1 = puVar5 + 2;
    if ((long *)*puVar5 == plVar1) {
      local_50 = *plVar1;
      uStack_48 = puVar5[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar1;
      local_60 = (long *)*puVar5;
    }
    local_58 = puVar5[1];
    *puVar5 = plVar1;
    puVar5[1] = 0;
    *(undefined1 *)plVar1 = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    uVar7 = __val;
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  } while( true );
}

Assistant:

std::string makeUniqueName (const std::string& root) const
        {
            return addSuffixToMakeUnique (root,
                                          [this] (const std::string& name)
                                          {
                                              for (auto& f : getFunctions())
                                                  if (f->name == name)
                                                      return true;

                                              for (auto& s : getStructDeclarations())
                                                  if (s->name == name)
                                                      return true;

                                              for (auto& u : getUsingDeclarations())
                                                  if (u->name == name)
                                                      return true;

                                              for (auto& s : getSubModules())
                                                  if (s->name == name)
                                                      return true;

                                              for (auto& a : getProcessorAliases())
                                                  if (a->name == name)
                                                      return true;

                                              for (auto& p : getProcessorInstances())
                                                  if (p->instanceName->toString() == name)
                                                      return true;

                                              return false;
                                          });
        }